

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dashel-posix.cpp
# Opt level: O3

int Dashel::getOrCreateSocket(ParameterSet *target)

{
  int iVar1;
  int iVar2;
  string *name;
  DashelException *this;
  int *piVar3;
  IPV4Address remoteAddress;
  sockaddr_in addr;
  IPV4Address local_58;
  string local_50;
  sockaddr local_30;
  
  iVar1 = ParameterSet::get<int>(target,"sock");
  if (-1 < iVar1) {
    return iVar1;
  }
  iVar1 = socket(2,1,6);
  if (iVar1 < 0) {
    this = (DashelException *)__cxa_allocate_exception(0x20);
    piVar3 = __errno_location();
    DashelException::DashelException
              (this,ConnectionFailed,*piVar3,"Cannot create socket.",(Stream *)0x0);
  }
  else {
    name = ParameterSet::get_abi_cxx11_(target,"host");
    iVar2 = ParameterSet::get<int>(target,"port");
    IPV4Address::IPV4Address(&local_58,name,(unsigned_short)iVar2);
    local_30.sa_family = 2;
    local_30.sa_data._0_2_ = local_58.port << 8 | local_58.port >> 8;
    local_30.sa_data._2_4_ =
         local_58.address >> 0x18 | (local_58.address & 0xff0000) >> 8 |
         (local_58.address & 0xff00) << 8 | local_58.address << 0x18;
    iVar2 = connect(iVar1,&local_30,0x10);
    if (iVar2 == 0) {
      IPV4Address::format_abi_cxx11_(&local_50,&local_58,true);
      ParameterSet::add(target,local_50._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
      ParameterSet::erase(target,"connectionPort");
      return iVar1;
    }
    this = (DashelException *)__cxa_allocate_exception(0x20);
    piVar3 = __errno_location();
    DashelException::DashelException
              (this,ConnectionFailed,*piVar3,"Cannot connect to remote host.",(Stream *)0x0);
  }
  __cxa_throw(this,&DashelException::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

static int getOrCreateSocket(ParameterSet& target)
	{
		int fd = target.get<int>("sock");
		if (fd < 0)
		{
			// create socket
			fd = socket(AF_INET, SOCK_STREAM, IPPROTO_TCP);
			if (fd < 0)
				throw DashelException(DashelException::ConnectionFailed, errno, "Cannot create socket.");

			IPV4Address remoteAddress(target.get("host"), target.get<int>("port"));

			// connect
			sockaddr_in addr;
			addr.sin_family = AF_INET;
			addr.sin_port = htons(remoteAddress.port);
			addr.sin_addr.s_addr = htonl(remoteAddress.address);
			if (connect(fd, (struct sockaddr*)&addr, sizeof(addr)) != 0)
				throw DashelException(DashelException::ConnectionFailed, errno, "Cannot connect to remote host.");

			// overwrite target name with a canonical one
			target.add(remoteAddress.format().c_str());
			target.erase("connectionPort");
		}
		return fd;
	}